

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O3

void polygon_web_validate(Am_Web_Events *events)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Am_Slot_Key AVar4;
  Am_Drawonable *pAVar5;
  Am_Value *pAVar6;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar7;
  Am_Wrapper *value;
  char *pcVar8;
  ostream *poVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int height;
  int top;
  int left;
  Am_Object self;
  int width;
  Am_Style ls;
  int pl_top;
  int pl_left;
  Am_Point_List pl;
  int curr_width;
  int curr_top;
  int curr_left;
  int pl_height;
  int pl_width;
  Am_Point_List new_pl;
  Am_Slot slot;
  int local_dc;
  int local_d8;
  int local_d4;
  Am_Object local_d0;
  float local_c4;
  int local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  Am_Drawonable *local_b0;
  Am_Style local_a8;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  int local_8c;
  int local_88;
  int local_84;
  Am_Style local_80;
  Am_Point_List local_78;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  Am_Point_List local_50;
  Am_Slot local_40;
  Am_Object local_38;
  
  Am_Web_Events::End(events);
  local_40 = Am_Web_Events::Get(events);
  Am_Slot::Get_Owner((Am_Slot *)&local_50);
  Am_Object::Am_Object(&local_d0,(Am_Object *)&local_50);
  Am_Object::~Am_Object((Am_Object *)&local_50);
  Am_Object::Am_Object(&local_38,&local_d0);
  pAVar5 = Get_a_drawonable(&local_38);
  Am_Object::~Am_Object(&local_38);
  pAVar6 = Am_Object::Get(&local_d0,0xb2,0);
  Am_Point_List::Am_Point_List(&local_78,pAVar6);
  pAVar6 = Am_Object::Get(&local_d0,0x6b,0);
  Am_Style::Am_Style(&local_a8,pAVar6);
  pAVar6 = Am_Object::Get(&local_d0,100,0);
  local_d4 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(&local_d0,0x65,0);
  local_d8 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(&local_d0,0x66,0);
  local_c0 = Am_Value::operator_cast_to_int(pAVar6);
  local_b0 = pAVar5;
  pAVar6 = Am_Object::Get(&local_d0,0x67,0);
  local_dc = Am_Value::operator_cast_to_int(pAVar6);
  Am_Web_Events::End(events);
  while (bVar1 = Am_Web_Events::First(events), !bVar1) {
    local_40 = Am_Web_Events::Get(events);
    AVar4 = Am_Slot::Get_Key(&local_40);
    switch(AVar4) {
    case 100:
      pAVar6 = Am_Web_Events::Get_Prev_Value(events);
      local_d4 = Am_Value::operator_cast_to_int(pAVar6);
      break;
    case 0x65:
      pAVar6 = Am_Web_Events::Get_Prev_Value(events);
      local_d8 = Am_Value::operator_cast_to_int(pAVar6);
      break;
    case 0x66:
      pAVar6 = Am_Web_Events::Get_Prev_Value(events);
      local_c0 = Am_Value::operator_cast_to_int(pAVar6);
      break;
    case 0x67:
      pAVar6 = Am_Web_Events::Get_Prev_Value(events);
      local_dc = Am_Value::operator_cast_to_int(pAVar6);
      break;
    case 0x68:
      break;
    case 0x69:
    case 0x6a:
switchD_001e7ad0_caseD_69:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** Bug: unexpected slot in polygon_web_validate: ",0x31);
      pcVar8 = Am_Get_Slot_Name(AVar4);
      poVar9 = std::operator<<((ostream *)&std::cerr,pcVar8);
      std::endl<char,std::char_traits<char>>(poVar9);
      Am_Error();
    case 0x6b:
      pAVar6 = Am_Web_Events::Get_Prev_Value(events);
      Am_Style::operator=(&local_a8,pAVar6);
      break;
    default:
      if (AVar4 != 0x7d2) {
        if (AVar4 != 0xb2) goto switchD_001e7ad0_caseD_69;
        bVar2 = Am_Point_List::Valid(&local_78);
        if (bVar2 && local_b0 != (Am_Drawonable *)0x0) {
          (*local_b0->_vptr_Am_Drawonable[0x1c])
                    (local_b0,&local_78,&local_a8,&local_d4,&local_d8,&local_c0,&local_dc);
        }
        goto LAB_001e7bae;
      }
    }
    Am_Web_Events::Prev(events);
  }
LAB_001e7bae:
  Am_Web_Events::Next(events);
  bVar1 = !bVar1;
  bVar2 = false;
  local_c4 = 0.0;
  do {
    bVar3 = Am_Web_Events::Last(events);
    if (bVar3) {
      if ((((uint)local_c4 & 1) != 0) &&
         (bVar3 = Am_Point_List::Valid(&local_78), bVar3 && local_b0 != (Am_Drawonable *)0x0)) {
        Am_Style::Am_Style(&local_80,&local_a8);
        (*local_b0->_vptr_Am_Drawonable[0x1c])
                  (local_b0,&local_78,&local_80,&local_84,&local_88,&local_54,&local_58);
        if ((local_d4 != local_84) ||
           ((local_c0 != local_54 || local_d8 != local_88 ||
            (local_54 = local_c0, local_dc != local_58)))) {
          local_b8 = 0.25;
          local_c4 = 0.25;
          if (1 < local_c0) {
            local_b8 = (float)(local_c0 + -1);
          }
          if (local_54 < 2) {
            local_b4 = 0.25;
          }
          else {
            local_b4 = (float)(local_54 + -1);
          }
          if (local_dc < 2) {
            local_bc = 0.25;
          }
          else {
            local_bc = (float)(local_dc + -1);
          }
          if (1 < local_58) {
            local_c4 = (float)(local_58 + -1);
          }
          Am_Point_List::Am_Point_List(&local_50,&local_78);
          local_b8 = local_b8 / local_b4;
          local_90 = local_b8 * 0.5;
          local_b8 = local_b8 + local_b8;
          local_94 = (local_90 + local_b8) * 0.5;
          local_bc = local_bc / local_c4;
          local_9c = local_bc * 0.5;
          local_bc = local_bc + local_bc;
          local_98 = (local_9c + local_bc) * 0.5;
          Am_Point_List::Scale(&local_50,local_94,local_98,local_84,local_88,true);
          (*local_b0->_vptr_Am_Drawonable[0x1c])
                    (local_b0,&local_50,&local_80,&local_5c,&local_60,&local_64,&local_8c);
          fVar13 = local_94;
          fVar11 = local_98;
          for (iVar10 = 0x10; ((local_64 != local_c0 || (local_8c != local_dc)) && (0 < iVar10));
              iVar10 = iVar10 + -1) {
            fVar12 = fVar13;
            if ((local_64 < local_c0) || (fVar12 = local_90, local_64 <= local_c0)) {
              local_90 = fVar12;
              fVar13 = local_b8;
            }
            local_c4 = (local_90 + fVar13) * 0.5;
            fVar12 = fVar11;
            local_98 = local_bc;
            if ((local_dc <= local_8c) &&
               (fVar12 = local_9c, local_98 = fVar11, local_8c <= local_dc)) {
              local_98 = local_bc;
            }
            local_b4 = (fVar12 + local_98) * 0.5;
            local_9c = fVar12;
            local_94 = fVar13;
            Am_Point_List::operator=(&local_50,&local_78);
            Am_Point_List::Scale(&local_50,local_c4,local_b4,local_84,local_88,true);
            (*local_b0->_vptr_Am_Drawonable[0x1c])
                      (local_b0,&local_50,&local_80,&local_5c,&local_60,&local_64,&local_8c);
            local_b8 = local_94;
            local_bc = local_98;
            fVar13 = local_c4;
            fVar11 = local_b4;
          }
          Am_Point_List::Translate(&local_50,local_d4 - local_5c,local_d8 - local_60,true);
          Am_Point_List::operator=(&local_78,&local_50);
          Am_Point_List::~Am_Point_List(&local_50);
        }
        Am_Style::~Am_Style(&local_80);
      }
      if (bVar2) {
        value = Am_Point_List::operator_cast_to_Am_Wrapper_(&local_78);
        Am_Object::Set(&local_d0,0xb2,value,0);
      }
      if (bVar1) {
        Am_Object::Set(&local_d0,100,local_d4,0);
        Am_Object::Set(&local_d0,0x65,local_d8,0);
        Am_Object::Set(&local_d0,0x66,local_c0,0);
        Am_Object::Set(&local_d0,0x67,local_dc,0);
      }
      Am_Style::~Am_Style(&local_a8);
      Am_Point_List::~Am_Point_List(&local_78);
      Am_Object::~Am_Object(&local_d0);
      return;
    }
    local_40 = Am_Web_Events::Get(events);
    AVar4 = Am_Slot::Get_Key(&local_40);
    switch(AVar4) {
    case 100:
      pAVar6 = Am_Object::Get(&local_d0,100,4);
      iVar10 = Am_Value::operator_cast_to_int(pAVar6);
      Am_Point_List::Translate(&local_78,iVar10 - local_d4,0,true);
      local_d4 = iVar10;
      goto LAB_001e7cb9;
    case 0x65:
      pAVar6 = Am_Object::Get(&local_d0,0x65,4);
      iVar10 = Am_Value::operator_cast_to_int(pAVar6);
      Am_Point_List::Translate(&local_78,0,iVar10 - local_d8,true);
      local_d8 = iVar10;
LAB_001e7cb9:
      bVar2 = true;
      break;
    case 0x66:
      pAVar6 = Am_Object::Get(&local_d0,0x66,4);
      iVar10 = Am_Value::operator_cast_to_int(pAVar6);
      if (iVar10 < 2) {
        fVar13 = 0.25;
      }
      else {
        fVar13 = (float)(iVar10 + -1);
      }
      if (local_c0 < 2) {
        fVar11 = 0.25;
      }
      else {
        fVar11 = (float)(local_c0 + -1);
      }
      Am_Point_List::Scale(&local_78,fVar13 / fVar11,1.0,local_d4,local_d8,true);
      uVar7 = extraout_RAX;
      local_c0 = iVar10;
      goto LAB_001e7e29;
    case 0x67:
      pAVar6 = Am_Object::Get(&local_d0,0x67,4);
      iVar10 = Am_Value::operator_cast_to_int(pAVar6);
      if (iVar10 < 2) {
        fVar13 = 0.25;
      }
      else {
        fVar13 = (float)(iVar10 + -1);
      }
      if (local_dc < 2) {
        fVar11 = 0.25;
      }
      else {
        fVar11 = (float)(local_dc + -1);
      }
      Am_Point_List::Scale(&local_78,1.0,fVar13 / fVar11,local_d4,local_d8,true);
      uVar7 = extraout_RAX_00;
      local_dc = iVar10;
LAB_001e7e29:
      bVar2 = true;
      local_c4 = (float)CONCAT71((int7)((ulong)uVar7 >> 8),1);
      break;
    case 0x68:
switchD_001e7c13_caseD_68:
      bVar3 = Am_Point_List::Valid(&local_78);
      bVar1 = true;
      if (bVar3 && local_b0 != (Am_Drawonable *)0x0) {
LAB_001e7d00:
        bVar1 = true;
        (*local_b0->_vptr_Am_Drawonable[0x1c])
                  (local_b0,&local_78,&local_a8,&local_d4,&local_d8,&local_c0,&local_dc);
      }
      break;
    case 0x69:
    case 0x6a:
      break;
    case 0x6b:
      pAVar6 = Am_Object::Get(&local_d0,0x6b,4);
      Am_Style::operator=(&local_a8,pAVar6);
      bVar3 = Am_Point_List::Valid(&local_78);
      bVar1 = true;
      if (local_b0 != (Am_Drawonable *)0x0 && bVar3) goto LAB_001e7d00;
      break;
    default:
      if (AVar4 == 0x7d2) goto switchD_001e7c13_caseD_68;
    }
    Am_Web_Events::Next(events);
  } while( true );
}

Assistant:

static void
polygon_web_validate(Am_Web_Events &events)
{
  events.End();
  Am_Slot slot = events.Get();
  Am_Object self = slot.Get_Owner();
  Am_Drawonable *draw = Get_a_drawonable(self);
  Am_Point_List pl = self.Get(Am_POINT_LIST);
  Am_Style ls = self.Get(Am_LINE_STYLE);
  int left = self.Get(Am_LEFT);
  int top = self.Get(Am_TOP);
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);

  bool rescaled = false;
  bool pl_changed = false;
  bool bbox_changed = false;

  // compute ORIGINAL values of left/top/width/height by working
  // backwards through the change events
  events.End();
  while (!events.First()) {
    slot = events.Get();

    Am_Slot_Key key = slot.Get_Key();
    if (key == Am_POINT_LIST) {
      // these changes supersedes all earlier changes, so find its
      // bounding box and stop looking backwards
      if (pl.Valid() && draw)
        draw->Get_Polygon_Bounding_Box(pl, ls, left, top, width, height);
      bbox_changed = true;
      break;
    } else
      switch (key) {
      case Am_WINDOW:
      case Am_DRAWONABLE:
        break;
      case Am_LINE_STYLE:
        ls = events.Get_Prev_Value();
        break;
      case Am_LEFT:
        left = events.Get_Prev_Value();
        break;
      case Am_TOP:
        top = events.Get_Prev_Value();
        break;
      case Am_WIDTH:
        width = events.Get_Prev_Value();
        break;
      case Am_HEIGHT:
        height = events.Get_Prev_Value();
        break;

      default:
        Am_ERROR("** Bug: unexpected slot in polygon_web_validate: "
                 << Am_Get_Slot_Name(key));
      }

    events.Prev();
  }

  // now go forwards, looking at the CHANGES made to each slot
  events.Next();
  while (!events.Last()) {
    slot = events.Get();
    switch (slot.Get_Key()) {
#if 0
    case Am_POINT_LIST:
      pl = self.Get (Am_POINT_LIST);
      if (pl.Valid() && draw)
	draw->Get_Polygon_Bounding_Box(pl, ls, left, top, width, height);
      bbox_changed = true;
      break;
#endif

    case Am_WINDOW:
    case Am_DRAWONABLE:
      if (pl.Valid() && draw)
        draw->Get_Polygon_Bounding_Box(pl, ls, left, top, width, height);
      bbox_changed = true;
      break;

    case Am_LINE_STYLE:
      // recompute bounding box with new line style
      ls = self.Get(Am_LINE_STYLE, Am_NO_DEPENDENCY);
      if (pl.Valid() && draw)
        draw->Get_Polygon_Bounding_Box(pl, ls, left, top, width, height);
      bbox_changed = true;
      break;

    case Am_LEFT: {
      int new_left = self.Get(Am_LEFT, Am_NO_DEPENDENCY);
      pl.Translate(new_left - left, 0);
      left = new_left;
      pl_changed = true;
      break;
    }

    case Am_TOP: {
      int new_top = self.Get(Am_TOP, Am_NO_DEPENDENCY);
      pl.Translate(0, new_top - top);
      top = new_top;
      pl_changed = true;
      break;
    }

    case Am_WIDTH: {
      int new_width = self.Get(Am_WIDTH, Am_NO_DEPENDENCY);
      pl.Scale(scale_factor(new_width, width), 1.0f, left, top);
      width = new_width;
      rescaled = true;
      pl_changed = true;
      break;
    }

    case Am_HEIGHT: {
      int new_height = self.Get(Am_HEIGHT, Am_NO_DEPENDENCY);
      pl.Scale(1.0f, scale_factor(new_height, height), left, top);
      height = new_height;
      rescaled = true;
      pl_changed = true;
      break;
    }
    }
    events.Next();
  }

  if (rescaled && pl.Valid() && draw)
    // check that scaling produced a polygon with the correct bounding box.
    // how could this fail?  several possibilities: line thickness
    // doesn't scale;  and mitered joins may grow or shrink
    // orthogonally to the scaling.

    general_polygon_validate(pl, left, top, width, height, ls, draw);

#ifdef TEST_POLYGON_CONSTRAINT
  // debugging check that bounding box is correct
  if (pl.Valid() && draw) {
    int curr_left, curr_top, curr_width, curr_height;
    draw->Get_Polygon_Bounding_Box(pl, ls, curr_left, curr_top, curr_width,
                                   curr_height);
    if (!(left == curr_left && top == curr_top && width == curr_width &&
          height == curr_height))
      std::cout << "** polygon_web_validate: bounding box (" << left << ","
                << top << "," << width << "," << height << ")"
                << " inconsistent with point list (" << curr_left << ","
                << curr_top << "," << curr_width << "," << curr_height << ")"
                << std::endl;
  }
#endif

  if (pl_changed)
    self.Set(Am_POINT_LIST, pl);

  if (bbox_changed) {
    self.Set(Am_LEFT, left);
    self.Set(Am_TOP, top);
    self.Set(Am_WIDTH, width);
    self.Set(Am_HEIGHT, height);
  }
}